

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_insert_window(nk_context *ctx,nk_window *win,nk_window_insert_location loc)

{
  byte *pbVar1;
  nk_window *pnVar2;
  nk_window **ppnVar3;
  nk_window *pnVar4;
  bool bVar5;
  
  ppnVar3 = &ctx->begin;
  pnVar2 = ctx->begin;
  pnVar4 = pnVar2;
  while( true ) {
    if (pnVar4 == (nk_window *)0x0) {
      if (pnVar2 == (nk_window *)0x0) {
        win->next = (nk_window *)0x0;
        win->prev = (nk_window *)0x0;
        ctx->begin = win;
        ctx->end = win;
        ctx->count = 1;
      }
      else {
        if (loc == NK_INSERT_BACK) {
          pnVar2 = ctx->end;
          pnVar2->flags = pnVar2->flags | 0x1000;
          pnVar2->next = win;
          win->prev = pnVar2;
          win->next = (nk_window *)0x0;
          ctx->end = win;
          ppnVar3 = &ctx->active;
        }
        else {
          pnVar2->prev = win;
          win->next = pnVar2;
          win->prev = (nk_window *)0x0;
        }
        *ppnVar3 = win;
        pbVar1 = (byte *)((long)&win->flags + 1);
        *pbVar1 = *pbVar1 & 0xef;
        ctx->count = ctx->count + 1;
      }
      return;
    }
    if (pnVar4 == pnVar4->next) break;
    bVar5 = pnVar4 == win;
    pnVar4 = pnVar4->next;
    if (bVar5) {
      __assert_fail("iter != win",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x3ee8,
                    "void nk_insert_window(struct nk_context *, struct nk_window *, enum nk_window_insert_location)"
                   );
    }
  }
  __assert_fail("iter != iter->next",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x3ee7,
                "void nk_insert_window(struct nk_context *, struct nk_window *, enum nk_window_insert_location)"
               );
}

Assistant:

NK_LIB void
nk_insert_window(struct nk_context *ctx, struct nk_window *win,
    enum nk_window_insert_location loc)
{
    const struct nk_window *iter;
    NK_ASSERT(ctx);
    NK_ASSERT(win);
    if (!win || !ctx) return;

    iter = ctx->begin;
    while (iter) {
        NK_ASSERT(iter != iter->next);
        NK_ASSERT(iter != win);
        if (iter == win) return;
        iter = iter->next;
    }

    if (!ctx->begin) {
        win->next = 0;
        win->prev = 0;
        ctx->begin = win;
        ctx->end = win;
        ctx->count = 1;
        return;
    }
    if (loc == NK_INSERT_BACK) {
        struct nk_window *end;
        end = ctx->end;
        end->flags |= NK_WINDOW_ROM;
        end->next = win;
        win->prev = ctx->end;
        win->next = 0;
        ctx->end = win;
        ctx->active = ctx->end;
        ctx->end->flags &= ~(nk_flags)NK_WINDOW_ROM;
    } else {
        /*ctx->end->flags |= NK_WINDOW_ROM;*/
        ctx->begin->prev = win;
        win->next = ctx->begin;
        win->prev = 0;
        ctx->begin = win;
        ctx->begin->flags &= ~(nk_flags)NK_WINDOW_ROM;
    }
    ctx->count++;
}